

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

void __thiscall irr::gui::CGUITabControl::recalculateScrollButtonPlacement(CGUITabControl *this)

{
  int iVar1;
  IGUIButton *pIVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  EGUI_ALIGNMENT EVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  rect<int> local_40;
  
  plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  iVar7 = this->TabHeight;
  iVar3 = iVar7 + -2;
  if (iVar7 < 2) {
    iVar3 = iVar7;
  }
  if (plVar5 == (long *)0x0) {
    iVar7 = 0x10;
  }
  else {
    iVar4 = (**(code **)(*plVar5 + 0x10))(plVar5,2);
    iVar7 = this->TabHeight;
    if (iVar4 < this->TabHeight) {
      iVar7 = iVar4;
    }
  }
  iVar4 = *(int *)&this->field_0x30;
  iVar1 = *(int *)&this->field_0x38;
  bVar9 = this->VerticalAlignment == EGUIA_UPPERLEFT;
  if (bVar9) {
    iVar8 = (this->TabHeight / 2 - iVar3 / 2) + 2;
  }
  else {
    iVar8 = (((*(int *)&this->field_0x3c - iVar3 / 2) - *(int *)&this->field_0x34) -
            this->TabHeight / 2) + -2;
  }
  EVar6 = (EGUI_ALIGNMENT)!bVar9;
  pIVar2 = this->UpButton;
  (pIVar2->super_IGUIElement).AlignLeft = EGUIA_LOWERRIGHT;
  (pIVar2->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
  (pIVar2->super_IGUIElement).AlignTop = EVar6;
  (pIVar2->super_IGUIElement).AlignBottom = EVar6;
  pIVar2 = this->DownButton;
  (pIVar2->super_IGUIElement).AlignLeft = EGUIA_LOWERRIGHT;
  (pIVar2->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
  (pIVar2->super_IGUIElement).AlignTop = EVar6;
  (pIVar2->super_IGUIElement).AlignBottom = EVar6;
  iVar4 = ~(int)((float)iVar7 * 2.5) + (iVar1 - iVar4);
  local_40.UpperLeftCorner.X = iVar4;
  local_40.UpperLeftCorner.Y = iVar8;
  local_40.LowerRightCorner.X = iVar7 + iVar4;
  local_40.LowerRightCorner.Y = iVar3 + iVar8;
  IGUIElement::setRelativePosition(&this->UpButton->super_IGUIElement,&local_40);
  local_40.UpperLeftCorner.X = iVar7 + 1 + iVar4;
  local_40.LowerRightCorner.X = iVar7 + iVar4 + iVar7 + 1;
  local_40.UpperLeftCorner.Y = iVar8;
  local_40.LowerRightCorner.Y = iVar3 + iVar8;
  IGUIElement::setRelativePosition(&this->DownButton->super_IGUIElement,&local_40);
  return;
}

Assistant:

void CGUITabControl::recalculateScrollButtonPlacement()
{
	IGUISkin *skin = Environment->getSkin();
	s32 ButtonSize = 16;
	s32 ButtonHeight = TabHeight - 2;
	if (ButtonHeight < 0)
		ButtonHeight = TabHeight;
	if (skin) {
		ButtonSize = skin->getSize(EGDS_WINDOW_BUTTON_WIDTH);
		if (ButtonSize > TabHeight)
			ButtonSize = TabHeight;
	}

	s32 ButtonX = RelativeRect.getWidth() - (s32)(2.5f * (f32)ButtonSize) - 1;
	s32 ButtonY = 0;

	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		ButtonY = 2 + (TabHeight / 2) - (ButtonHeight / 2);
		UpButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	} else {
		ButtonY = RelativeRect.getHeight() - (TabHeight / 2) - (ButtonHeight / 2) - 2;
		UpButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT);
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT);
	}

	UpButton->setRelativePosition(core::rect<s32>(ButtonX, ButtonY, ButtonX + ButtonSize, ButtonY + ButtonHeight));
	ButtonX += ButtonSize + 1;
	DownButton->setRelativePosition(core::rect<s32>(ButtonX, ButtonY, ButtonX + ButtonSize, ButtonY + ButtonHeight));
}